

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_thrower.hpp
# Opt level: O0

string * __thiscall
asd::detail::formatter<unsigned_long_const&>
          (string *__return_storage_ptr__,detail *this,char *fmt,unsigned_long *head)

{
  char *format;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  ostringstream local_1c0 [8];
  ostringstream oss;
  detail *local_48;
  char *i;
  string str;
  unsigned_long *head_local;
  char *fmt_local;
  
  str.field_2._8_8_ = fmt;
  std::__cxx11::string::string((string *)&i);
  local_48 = this;
  do {
    if (*local_48 == (detail)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&i);
LAB_0020db7a:
      std::__cxx11::string::~string((string *)&i);
      return __return_storage_ptr__;
    }
    if (*local_48 == (detail)0x25) {
      std::__cxx11::ostringstream::ostringstream(local_1c0);
      std::ostream::operator<<((ostream *)local_1c0,*(ulong *)str.field_2._8_8_);
      std::__cxx11::ostringstream::str();
      std::operator+(&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                     &local_210);
      formatter_abi_cxx11_(&local_230,local_48 + 1,format);
      std::operator+(__return_storage_ptr__,&local_1f0,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::ostringstream::~ostringstream(local_1c0);
      goto LAB_0020db7a;
    }
    std::__cxx11::string::operator+=((string *)&i,(char)*local_48);
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

std::string
formatter(const char* fmt, T&& head, Ts&& ... tail)
{
    std::string str;
    for(const char* i(fmt); *i != '\0'; ++i)
    {
        if(*i == '%')
        {
            std::ostringstream oss;
            oss << head;
            ++i;
            return str + oss.str() + formatter(i, std::forward<Ts>(tail)...);
        }
        else
        {
            str += *i;
        }
    }
    return str;
}